

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache_tests.cpp
# Opt level: O0

void __thiscall
cuckoocache_tests::cuckoocache_hit_rate_ok::test_method(cuckoocache_hit_rate_ok *this)

{
  bool bVar1;
  const_string *in_RDI;
  long in_FS_OFFSET;
  double hits;
  double load;
  size_t megabytes;
  double HitRateThresh;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  assertion_result *in_stack_ffffffffffffff18;
  undefined1 *load_00;
  const_string *msg;
  lazy_ostream *in_stack_ffffffffffffff38;
  unit_test_log_t *in_stack_ffffffffffffff48;
  double local_a0;
  const_string local_80 [2];
  lazy_ostream local_60 [2];
  element_type *in_stack_ffffffffffffffc8;
  shared_count in_stack_ffffffffffffffd0;
  HitRateTest *in_stack_ffffffffffffffd8;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_a0 = 0.1; local_a0 < 2.0; local_a0 = local_a0 * 2.0) {
    HitRateTest::test_cache<CuckooCache::cache<uint256,SignatureCacheHasher>>
              (in_stack_ffffffffffffffd8,(size_t)in_stack_ffffffffffffffd0.pi_,
               (double)in_stack_ffffffffffffffc8);
    do {
      load_00 = local_18;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffff18,
                 (pointer)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                 (unsigned_long)in_stack_ffffffffffffff08);
      msg = (const_string *)&stack0xffffffffffffffd8;
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffff08);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_ffffffffffffff48,in_RDI,(size_t)in_stack_ffffffffffffff38,msg);
      HitRateTest::normalize_hit_rate((double)in_stack_ffffffffffffff18,(double)load_00);
      boost::test_tools::assertion_result::assertion_result
                (in_stack_ffffffffffffff18,(bool)in_stack_ffffffffffffff17);
      in_stack_ffffffffffffff38 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffff18,
                 (pointer)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                 (unsigned_long)in_stack_ffffffffffffff08);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                 (basic_cstring<const_char> *)in_stack_ffffffffffffff08);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffff18,
                 (pointer)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                 (unsigned_long)in_stack_ffffffffffffff08);
      in_stack_ffffffffffffff08 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&stack0xffffffffffffffc0,local_60,local_80,0x78,CHECK,
                 CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(in_stack_ffffffffffffff08);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffff08);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(cuckoocache_hit_rate_ok, HitRateTest)
{
    /** Arbitrarily selected Hit Rate threshold that happens to work for this test
     * as a lower bound on performance.
     */
    double HitRateThresh = 0.98;
    size_t megabytes = 4;
    for (double load = 0.1; load < 2; load *= 2) {
        double hits = test_cache<CuckooCache::cache<uint256, SignatureCacheHasher>>(megabytes, load);
        BOOST_CHECK(normalize_hit_rate(hits, load) > HitRateThresh);
    }
}